

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O0

SpirVAsmSource * __thiscall
vk::ProgramCollection<vk::SpirVAsmSource>::add
          (ProgramCollection<vk::SpirVAsmSource> *this,string *name)

{
  mapped_type pSVar1;
  SpirVAsmSource *pSVar2;
  mapped_type *ppSVar3;
  undefined1 local_28 [8];
  MovePtr<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_> prog;
  string *name_local;
  ProgramCollection<vk::SpirVAsmSource> *this_local;
  
  prog.super_UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>.m_data._8_8_ =
       name;
  de::details::newMovePtr<vk::SpirVAsmSource>();
  pSVar2 = de::details::UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>::get
                     ((UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_> *)
                      local_28);
  ppSVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>_>
            ::operator[](&this->m_programs,
                         (key_type *)
                         prog.
                         super_UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>
                         .m_data._8_8_);
  *ppSVar3 = pSVar2;
  de::details::MovePtr<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>::release
            ((MovePtr<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_> *)local_28);
  ppSVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>_>
            ::operator[](&this->m_programs,
                         (key_type *)
                         prog.
                         super_UniqueBase<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>
                         .m_data._8_8_);
  pSVar1 = *ppSVar3;
  de::details::MovePtr<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_>::~MovePtr
            ((MovePtr<vk::SpirVAsmSource,_de::DefaultDeleter<vk::SpirVAsmSource>_> *)local_28);
  return pSVar1;
}

Assistant:

Program& ProgramCollection<Program>::add (const std::string& name)
{
	DE_ASSERT(!contains(name));
	de::MovePtr<Program> prog = de::newMovePtr<Program>();
	m_programs[name] = prog.get();
	prog.release();
	return *m_programs[name];
}